

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

string * __thiscall
glcts::TessellationShaderInvarianceRule2Test::getTECode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderInvarianceRule2Test *this,
          uint n_iteration)

{
  _tessellation_primitive_mode *p_Var1;
  bool point_mode;
  _tessellation_shader_vertex_ordering vertex_ordering;
  _tessellation_primitive_mode primitive_mode;
  uint bo_size;
  float inner_tess_levels [2];
  float outer_tess_levels [4];
  
  bo_size = 0;
  inner_tess_levels[0] = 0.0;
  inner_tess_levels[1] = 0.0;
  outer_tess_levels[0] = 0.0;
  outer_tess_levels[1] = 0.0;
  outer_tess_levels[2] = 0.0;
  outer_tess_levels[3] = 0.0;
  point_mode = false;
  p_Var1 = &primitive_mode;
  vertex_ordering = TESSELLATION_SHADER_PRIMITIVE_MODE_COUNT;
  primitive_mode = vertex_ordering;
  (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
    super_TestNode._vptr_TestNode[0xb])
            (this,(ulong)n_iteration,inner_tess_levels,outer_tess_levels,&point_mode,p_Var1,
             &vertex_ordering,&bo_size);
  TessellationShaderUtils::getGenericTECode_abi_cxx11_
            (__return_storage_ptr__,(TessellationShaderUtils *)0x0,primitive_mode,vertex_ordering,
             (uint)point_mode,SUB81(p_Var1,0));
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderInvarianceRule2Test::getTECode(unsigned int n_iteration)
{
	unsigned int						 bo_size			  = 0;
	float								 inner_tess_levels[2] = { 0 };
	float								 outer_tess_levels[4] = { 0 };
	bool								 point_mode			  = false;
	_tessellation_primitive_mode		 primitive_mode		  = TESSELLATION_SHADER_PRIMITIVE_MODE_UNKNOWN;
	_tessellation_shader_vertex_ordering vertex_ordering	  = TESSELLATION_SHADER_VERTEX_ORDERING_UNKNOWN;

	getIterationProperties(n_iteration, inner_tess_levels, outer_tess_levels, &point_mode, &primitive_mode,
						   &vertex_ordering, &bo_size);

	return TessellationShaderUtils::getGenericTECode(TESSELLATION_SHADER_VERTEX_SPACING_EQUAL, primitive_mode,
													 vertex_ordering, point_mode);
}